

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertNumbersArrayWithin
               (UNITY_UINT delta,void *expected,void *actual,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_DISPLAY_STYLE_T style,UNITY_FLAGS_T flags)

{
  bool bVar1;
  int iVar2;
  UNITY_DISPLAY_STYLE_T UVar3;
  ulong uVar4;
  ulong uVar5;
  UNITY_UINT number;
  ulong number_00;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (num_elements == 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_0010403f:
      UnityAddMsgIfSpecified(msg);
    }
    else {
      if (expected == actual) {
        return;
      }
      iVar2 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar2 == 0) {
        UVar3 = style & 0xf;
        number = 0;
        do {
          if (UVar3 == 8) {
            uVar4 = *expected;
            number_00 = *actual;
            UVar3 = 8;
LAB_00103f50:
            bVar1 = false;
          }
          else {
            if (UVar3 == 2) {
              uVar4 = (ulong)(short)*expected;
              number_00 = (ulong)(short)*actual;
              UVar3 = 2;
            }
            else {
              if (UVar3 != 1) {
                uVar4 = (ulong)(int)*expected;
                number_00 = (ulong)(int)*actual;
                UVar3 = 4;
                goto LAB_00103f50;
              }
              uVar4 = (ulong)(char)*expected;
              number_00 = (ulong)(char)*actual;
              UVar3 = 1;
            }
            bVar1 = true;
          }
          if ((style & 0x10) == 0) {
            uVar5 = number_00 - uVar4;
            if (number_00 < uVar4 || uVar5 == 0) {
LAB_00103f60:
              uVar5 = uVar4 - number_00;
            }
          }
          else {
            uVar5 = number_00 - uVar4;
            if (uVar5 == 0 || (long)number_00 < (long)uVar4) goto LAB_00103f60;
          }
          Unity.CurrentTestFailed = (UNITY_UINT)(delta < uVar5);
          if (delta < uVar5) {
            if (bVar1 && (style & 0x20) != 0) {
              uVar5 = ~(-1L << ((byte)(UVar3 << 3) & 0x3f));
              uVar4 = uVar4 & uVar5;
              number_00 = number_00 & uVar5;
            }
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(" Values Not Within Delta ");
            UnityPrintNumberByStyle(delta,style);
            UnityPrint(" Element ");
            UnityPrintNumberUnsigned(number);
            UnityPrint(" Expected ");
            UnityPrintNumberByStyle(uVar4,style);
            UnityPrint(" Was ");
            UnityPrintNumberByStyle(number_00,style);
            goto LAB_0010403f;
          }
          uVar4 = 0;
          if (flags == UNITY_ARRAY_TO_ARRAY) {
            uVar4 = (ulong)UVar3;
          }
          expected = (void *)((long)expected + uVar4);
          actual = (void *)((long)actual + (ulong)UVar3);
          number = number + 1;
          if (num_elements == (UNITY_UINT32)number) {
            return;
          }
        } while( true );
      }
    }
    Unity.CurrentTestFailed = 1;
  }
  longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
}

Assistant:

void UnityAssertNumbersArrayWithin(const UNITY_UINT delta,
                                   UNITY_INTERNAL_PTR expected,
                                   UNITY_INTERNAL_PTR actual,
                                   const UNITY_UINT32 num_elements,
                                   const char* msg,
                                   const UNITY_LINE_TYPE lineNumber,
                                   const UNITY_DISPLAY_STYLE_T style,
                                   const UNITY_FLAGS_T flags)
{
    UNITY_UINT32 elements = num_elements;
    unsigned int length   = style & 0xF;
    unsigned int increment = 0;

    RETURN_IF_FAIL_OR_IGNORE;

    if (num_elements == 0)
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual)
    {
        return; /* Both are NULL or same pointer */
    }

    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
    {
        UNITY_FAIL_AND_BAIL;
    }

    while ((elements > 0) && (elements--))
    {
        UNITY_INT expect_val;
        UNITY_INT actual_val;

        switch (length)
        {
            case 1:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT8*)actual;
                increment  = sizeof(UNITY_INT8);
                break;

            case 2:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT16*)actual;
                increment  = sizeof(UNITY_INT16);
                break;

#ifdef UNITY_SUPPORT_64
            case 8:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT64*)actual;
                increment  = sizeof(UNITY_INT64);
                break;
#endif

            default: /* default is length 4 bytes */
            case 4:
                expect_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)expected;
                actual_val = *(UNITY_PTR_ATTRIBUTE const UNITY_INT32*)actual;
                increment  = sizeof(UNITY_INT32);
                length = 4;
                break;
        }

        if ((style & UNITY_DISPLAY_RANGE_INT) == UNITY_DISPLAY_RANGE_INT)
        {
            if (actual_val > expect_val)
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)actual_val - (UNITY_UINT)expect_val) > delta);
            }
            else
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)expect_val - (UNITY_UINT)actual_val) > delta);
            }
        }
        else
        {
            if ((UNITY_UINT)actual_val > (UNITY_UINT)expect_val)
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)actual_val - (UNITY_UINT)expect_val) > delta);
            }
            else
            {
                Unity.CurrentTestFailed = (((UNITY_UINT)expect_val - (UNITY_UINT)actual_val) > delta);
            }
        }

        if (Unity.CurrentTestFailed)
        {
            if ((style & UNITY_DISPLAY_RANGE_UINT) && (length < (UNITY_INT_WIDTH / 8)))
            {   /* For UINT, remove sign extension (padding 1's) from signed type casts above */
                UNITY_INT mask = 1;
                mask = (mask << 8 * length) - 1;
                expect_val &= mask;
                actual_val &= mask;
            }
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(UnityStrDelta);
            UnityPrintNumberByStyle((UNITY_INT)delta, style);
            UnityPrint(UnityStrElement);
            UnityPrintNumberUnsigned(num_elements - elements - 1);
            UnityPrint(UnityStrExpected);
            UnityPrintNumberByStyle(expect_val, style);
            UnityPrint(UnityStrWas);
            UnityPrintNumberByStyle(actual_val, style);
            UnityAddMsgIfSpecified(msg);
            UNITY_FAIL_AND_BAIL;
        }
        /* Walk through array by incrementing the pointers */
        if (flags == UNITY_ARRAY_TO_ARRAY)
        {
            expected = (UNITY_INTERNAL_PTR)((const char*)expected + increment);
        }
        actual = (UNITY_INTERNAL_PTR)((const char*)actual + increment);
    }
}